

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bvcformata(bstring b,int count,char *fmt,__va_list_tag *arg)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  int local_3c;
  int l;
  int r;
  int n;
  __va_list_tag *arg_local;
  char *fmt_local;
  int count_local;
  bstring b_local;
  
  if ((((b == (bstring)0x0) || (fmt == (char *)0x0)) || (count < 1)) ||
     (((b->data == (uchar *)0x0 || (b->mlen < 1)) || ((b->slen < 0 || (b->mlen < b->slen)))))) {
    b_local._4_4_ = -1;
  }
  else {
    iVar3 = b->slen + count;
    if (iVar3 + 2 < count) {
      b_local._4_4_ = -1;
    }
    else {
      iVar1 = balloc(b,iVar3 + 2);
      if (iVar1 == 0) {
        local_3c = vsnprintf((char *)(b->data + b->slen),(long)(count + 2),fmt,arg);
        b->data[b->slen + count + 2] = '\0';
        iVar1 = b->slen;
        sVar2 = strlen((char *)(b->data + b->slen));
        iVar1 = iVar1 + (int)sVar2;
        if (iVar3 < iVar1) {
          b->data[b->slen] = '\0';
          if (local_3c <= count + 1) {
            if (count < 0x40000000) {
              local_3c = count * 2;
            }
            else {
              local_3c = 0x7fffffff;
            }
          }
          l = -local_3c;
          if (-2 < l) {
            l = -2;
          }
          b_local._4_4_ = l;
        }
        else {
          b->slen = iVar1;
          b_local._4_4_ = 0;
        }
      }
      else {
        b_local._4_4_ = -1;
      }
    }
  }
  return b_local._4_4_;
}

Assistant:

int bvcformata (bstring b, int count, const char * fmt, va_list arg) {
int n, r, l;

	if (b == NULL || fmt == NULL || count <= 0 || b->data == NULL
	 || b->mlen <= 0 || b->slen < 0 || b->slen > b->mlen) return BSTR_ERR;

	if (count > (n = b->slen + count) + 2) return BSTR_ERR;
	if (BSTR_OK != balloc (b, n + 2)) return BSTR_ERR;

	exvsnprintf (r, (char *) b->data + b->slen, count + 2, fmt, arg);
	b->data[b->slen + count + 2] = '\0';

	/* Did the operation complete successfully within bounds? */

	if (n >= (l = b->slen + (int) (strlen) ((char *) b->data + b->slen))) {
		b->slen = l;
		return BSTR_OK;
	}

	/* Abort, since the buffer was not large enough.  The return value
	   tries to help set what the retry length should be. */

	b->data[b->slen] = '\0';
	if (r > count+1) {
		l = r;
	} else {
		if (count > INT_MAX / 2)
			l = INT_MAX;
		else
			l = count + count;
	}
	n = -l;
	if (n > BSTR_ERR-1) n = BSTR_ERR-1;
	return n;
}